

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O0

void __thiscall ValidateDamageBin::ReadDamageBinDictFile(ValidateDamageBin *this,bool convertToBin)

{
  int iVar1;
  char *pcVar2;
  bool convertToBin_local;
  ValidateDamageBin *this_local;
  
  while (pcVar2 = fgets((char *)this,0x1000,_stdin), pcVar2 != (char *)0x0) {
    iVar1 = ScanDeprecatedFormat(this);
    if (iVar1 == 5) {
      if ((this->newFormat_ & 1U) != 0) {
        fprintf(_stderr,"ERROR: Deprecated format used in line %d:\n%s\n",
                (ulong)(uint)(this->super_Validate).lineno_);
        Validate::PrintErrorMessage(&this->super_Validate);
      }
    }
    else {
      iVar1 = ScanNewFormat(this);
      if (iVar1 == 4) {
        if ((this->newFormat_ & 1U) == 0) {
          fprintf(_stderr,"ERROR: Missing interval type column in line %d:\n%s\n",
                  (ulong)(uint)(this->super_Validate).lineno_);
          Validate::PrintErrorMessage(&this->super_Validate);
        }
        (this->dbd_).interval_type = 0;
      }
      else {
        fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
                (ulong)(uint)(this->super_Validate).lineno_);
        Validate::PrintErrorMessage(&this->super_Validate);
      }
    }
    CheckContiguousBinIndices(this);
    CheckInterpolationDamageValuesWithinRange(this);
    StoreLine(this);
    if (convertToBin) {
      ConvertToBin(this);
    }
  }
  return;
}

Assistant:

void ValidateDamageBin::ReadDamageBinDictFile(const bool convertToBin) {
/* After reading in a line from the csv file and checking for data integrity,
 * this method calls other methods to check for contiguous bin indices and
 * whether the interpolation value lies within the defined range. */

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanDeprecatedFormat() == 5) {

      if (newFormat_) {

        fprintf(stderr, "ERROR: Deprecated format used in line %d:\n%s\n",
                lineno_, line_);
        PrintErrorMessage();

      }

    } else if (ScanNewFormat() == 4) {

      if (!newFormat_) {

        fprintf(stderr, "ERROR: Missing interval type column in line %d:\n%s\n",
                lineno_, line_);
        PrintErrorMessage();

      }

      dbd_.interval_type = 0;

    } else {

      fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
      PrintErrorMessage();

    }

    CheckContiguousBinIndices();
    CheckInterpolationDamageValuesWithinRange();
    StoreLine();
    if (convertToBin) ConvertToBin();

  }

}